

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

mi_heap_t * mi_heap_new_ex(int heap_tag,_Bool allow_destroy,mi_arena_id_t arena_id)

{
  mi_heap_t *heap_00;
  mi_heap_t *heap;
  mi_heap_t *bheap;
  size_t in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  heap_00 = mi_heap_get_backing();
  local_8 = (mi_tld_t *)mi_heap_malloc(heap_00,in_stack_ffffffffffffffd8);
  if (local_8 == (mi_tld_t *)0x0) {
    local_8 = (mi_tld_t *)0x0;
  }
  else {
    _mi_heap_init(heap_00,local_8,0,false,0xb1);
  }
  return (mi_heap_t *)local_8;
}

Assistant:

mi_decl_nodiscard mi_heap_t* mi_heap_new_ex(int heap_tag, bool allow_destroy, mi_arena_id_t arena_id) {
  mi_heap_t* bheap = mi_heap_get_backing();
  mi_heap_t* heap = mi_heap_malloc_tp(bheap, mi_heap_t);  // todo: OS allocate in secure mode?
  if (heap == NULL) return NULL;
  mi_assert(heap_tag >= 0 && heap_tag < 256);
  _mi_heap_init(heap, bheap->tld, arena_id, allow_destroy /* no reclaim? */, (uint8_t)heap_tag /* heap tag */);
  return heap;
}